

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

void Curl_ssl_free_certinfo(Curl_easy *data)

{
  int iVar1;
  int i;
  long lVar2;
  
  iVar1 = (data->info).certs.num_of_certs;
  if (iVar1 != 0) {
    for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
      curl_slist_free_all((data->info).certs.certinfo[lVar2]);
      (data->info).certs.certinfo[lVar2] = (curl_slist *)0x0;
      iVar1 = (data->info).certs.num_of_certs;
    }
    (*Curl_cfree)((data->info).certs.certinfo);
    (data->info).certs.certinfo = (curl_slist **)0x0;
    (data->info).certs.num_of_certs = 0;
  }
  return;
}

Assistant:

void Curl_ssl_free_certinfo(struct Curl_easy *data)
{
  struct curl_certinfo *ci = &data->info.certs;

  if(ci->num_of_certs) {
    /* free all individual lists used */
    int i;
    for(i = 0; i < ci->num_of_certs; i++) {
      curl_slist_free_all(ci->certinfo[i]);
      ci->certinfo[i] = NULL;
    }

    free(ci->certinfo); /* free the actual array too */
    ci->certinfo = NULL;
    ci->num_of_certs = 0;
  }
}